

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O1

void __thiscall KDReports::Test::testEndlessPrinterBug(Test *this)

{
  char *__s;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  size_t len;
  longlong __tmp_1;
  longlong __tmp;
  long lVar8;
  longlong __tmp_3;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  AutoTableElement tableElement;
  QSqlTableModel tableModel;
  QSqlDatabase db;
  QSqlQuery query;
  Report report;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_58 [40];
  
  KDReports::Report::Report((Report *)(local_58 + 0x10),(QObject *)0x0);
  local_90._0_8_ = "QSQLITE";
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)(local_80 + 8),(char **)local_90);
  QVar9.m_data = (storage_type *)local_78.d;
  QVar9.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar9);
  local_d8.d._0_4_ = SUB84(local_b8.d,0);
  local_d8.d._4_2_ = (undefined2)((ulong)local_b8.d >> 0x20);
  local_d8.d._6_2_ = (undefined2)((ulong)local_b8.d >> 0x30);
  local_d8.ptr._0_6_ = SUB86(local_b8.ptr,0);
  local_d8.ptr._6_2_ = (undefined2)((ulong)local_b8.ptr >> 0x30);
  sVar7 = 0;
  local_b8.d = (Data *)0x0;
  local_d8.size = local_b8.size;
  local_b8.size = 0;
  local_b8.ptr = (char16_t *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  __s = QSqlDatabase::defaultConnection;
  if (QSqlDatabase::defaultConnection != (char *)0x0) {
    sVar7 = strlen(QSqlDatabase::defaultConnection);
  }
  len = sVar7;
  if ((long)sVar7 < 1) {
    len = 0;
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  if (__s == (char *)0x0) {
    len = 0;
  }
  if (__s != (char *)0x0 && (long)sVar7 < 0) {
    len = strlen(__s);
  }
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)local_90,__s,len);
  QVar10.m_data = (storage_type *)local_90._0_8_;
  QVar10.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar10);
  qVar3 = local_78.size;
  pcVar2 = local_78.ptr;
  pDVar1 = local_78.d;
  local_78.d = local_b8.d;
  local_b8.d = pDVar1;
  local_78.ptr = local_b8.ptr;
  local_78.size = local_b8.size;
  local_b8.ptr = pcVar2;
  local_b8.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QSqlDatabase::addDatabase((QString *)local_80,(QString *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_80 + 8));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_90._0_8_ = ":memory:";
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)(local_80 + 8),(char **)local_90);
  QVar11.m_data = (storage_type *)local_78.d;
  QVar11.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar11);
  local_d8.d._0_4_ = SUB84(local_b8.d,0);
  local_d8.d._4_2_ = (undefined2)((ulong)local_b8.d >> 0x20);
  local_d8.d._6_2_ = (undefined2)((ulong)local_b8.d >> 0x30);
  local_d8.ptr._0_6_ = SUB86(local_b8.ptr,0);
  local_d8.ptr._6_2_ = (undefined2)((ulong)local_b8.ptr >> 0x30);
  local_b8.d = (Data *)0x0;
  local_d8.size = local_b8.size;
  local_b8.size = 0;
  local_b8.ptr = (char16_t *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QSqlDatabase::setDatabaseName((QString *)local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  bVar4 = (bool)QSqlDatabase::open();
  cVar5 = QTest::qVerify(bVar4,"db.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                         ,0x73);
  if (cVar5 != '\0') {
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)&local_d8);
    QSqlQuery::QSqlQuery((QSqlQuery *)local_58,(QString *)&local_b8,(QSqlDatabase *)&local_d8);
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    local_90._0_8_ =
         "create table airlines (id int primary key, name varchar(20), homecountry varchar(2))";
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)(local_80 + 8),(char **)local_90);
    QVar12.m_data = (storage_type *)local_78.d;
    QVar12.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar12);
    local_d8.d._0_4_ = SUB84(local_b8.d,0);
    local_d8.d._4_2_ = (undefined2)((ulong)local_b8.d >> 0x20);
    local_d8.d._6_2_ = (undefined2)((ulong)local_b8.d >> 0x30);
    local_d8.ptr._0_6_ = SUB86(local_b8.ptr,0);
    local_d8.ptr._6_2_ = (undefined2)((ulong)local_b8.ptr >> 0x30);
    local_b8.d = (Data *)0x0;
    local_d8.size = local_b8.size;
    local_b8.size = 0;
    local_b8.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QSqlQuery::exec((QString *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    lVar8 = 0;
    do {
      local_58._8_8_ = "insert into airlines values(%0, \'Test%0\', \'T%0\')";
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)local_90,(char **)(local_58 + 8));
      QVar13.m_data = (storage_type *)local_90._0_8_;
      QVar13.m_size = (qsizetype)&local_b8;
      QString::fromUtf8(QVar13);
      local_78.d = local_b8.d;
      local_78.ptr = local_b8.ptr;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_78.size = local_b8.size;
      local_b8.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QString::arg((longlong)&local_d8,(int)(QArrayDataPointer<char16_t> *)(local_80 + 8),(int)lVar8
                   ,(QChar)0x0);
      QSqlQuery::exec((QString *)local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_80 + 8))
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 500);
    QSqlTableModel::QSqlTableModel
              ((QSqlTableModel *)local_90,(QObject *)0x0,(QSqlDatabase *)local_80);
    local_58._8_8_ = "airlines";
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)(local_80 + 8),(char **)(local_58 + 8));
    QVar14.m_data = (storage_type *)local_78.d;
    QVar14.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar14);
    local_d8.d._0_4_ = SUB84(local_b8.d,0);
    local_d8.d._4_2_ = (undefined2)((ulong)local_b8.d >> 0x20);
    local_d8.d._6_2_ = (undefined2)((ulong)local_b8.d >> 0x30);
    local_d8.ptr._0_6_ = SUB86(local_b8.ptr,0);
    local_d8.ptr._6_2_ = (undefined2)((ulong)local_b8.ptr >> 0x30);
    local_b8.d = (Data *)0x0;
    local_d8.size = local_b8.size;
    local_b8.size = 0;
    local_b8.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QSqlTableModel::setTable((QString *)local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QSqlTableModel::select();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_b8,(QAbstractItemModel *)local_90);
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_b8,0));
    local_d8.d._0_4_ = 0;
    local_d8.d._4_2_ = 0xffff;
    local_d8.d._6_2_ = 0;
    local_d8.ptr._0_6_ = 0;
    KDReports::Report::addElement(local_58 + 0x10,&local_b8,1);
    KDReports::Report::setWidthForEndlessPrinter(105.0);
    iVar6 = KDReports::Report::numberOfPages();
    QTest::qCompare(iVar6,1,"report.numberOfPages()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                    ,0x86);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_b8);
    QSqlTableModel::~QSqlTableModel((QSqlTableModel *)local_90);
    QSqlQuery::~QSqlQuery((QSqlQuery *)local_58);
  }
  QSqlDatabase::~QSqlDatabase((QSqlDatabase *)local_80);
  KDReports::Report::~Report((Report *)(local_58 + 0x10));
  return;
}

Assistant:

void testEndlessPrinterBug()
    {
        KDReports::Report report;
        QSqlDatabase db = QSqlDatabase::addDatabase("QSQLITE");
        db.setDatabaseName(":memory:");
        QVERIFY(db.open());

        // fill the DB with some test data
        QSqlQuery query;
        query.exec("create table airlines (id int primary key, "
                   "name varchar(20), homecountry varchar(2))");
        for (int i = 0; i < 500; i++)
            query.exec(QString("insert into airlines values(%0, 'Test%0', 'T%0')").arg(i));

        QSqlTableModel tableModel(nullptr, db);
        tableModel.setTable("airlines");
        tableModel.select();

        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setVerticalHeaderVisible(false);
        report.addElement(tableElement);

        report.setWidthForEndlessPrinter(105.0);

        QCOMPARE(report.numberOfPages(), 1);
    }